

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O3

void yprp_inout(lys_ypr_ctx_conflict *pctx,lysp_node_action_inout *inout,int8_t *flag)

{
  uint16_t *puVar1;
  lysp_restr *plVar2;
  lysp_tpdf *plVar3;
  char flag_00;
  ly_stmt substmt;
  uint uVar4;
  lysp_ext_instance *plVar5;
  lysp_ext_instance *plVar6;
  ulong uVar7;
  int8_t *flag_01;
  uint64_t u;
  lysp_ext_instance *plVar8;
  long lVar9;
  ulong uVar10;
  lysp_ext_instance *plVar11;
  lysp_node_grp *grp;
  lysp_node *node;
  
  if (inout->child != (lysp_node *)0x0) {
    flag_00 = *flag;
    if (flag_00 == '\0') {
      *flag = '\x01';
      ly_print_((pctx->field_0).field_0.out,">\n");
      flag_00 = *flag;
    }
    flag_01 = (int8_t *)(ulong)(uint)(int)flag_00;
    plVar8 = (lysp_ext_instance *)0x0;
    ypr_open(pctx,(inout->field_0).node.name,(char *)0x0,(char *)0x0,flag_00);
    puVar1 = &(pctx->field_0).field_0.level;
    *puVar1 = *puVar1 + 1;
    substmt = lyplg_ext_nodetype2stmt((inout->field_0).node.nodetype);
    plVar11 = (inout->field_0).node.exts;
    plVar6 = plVar11;
    while( true ) {
      if (plVar11 == (lysp_ext_instance *)0x0) {
        plVar5 = (lysp_ext_instance *)0x0;
      }
      else {
        plVar5 = plVar11[-1].exts;
      }
      if (plVar5 <= plVar8) break;
      flag_01 = (int8_t *)0x0;
      yprp_extension_instance(pctx,substmt,'\0',plVar6,(int8_t *)0x0);
      plVar8 = (lysp_ext_instance *)((long)&plVar8->name + 1);
      plVar6 = plVar6 + 1;
    }
    lVar9 = 0;
    plVar11 = (lysp_ext_instance *)0x0;
    while( true ) {
      plVar2 = inout->musts;
      if (plVar2 == (lysp_restr *)0x0) {
        plVar6 = (lysp_ext_instance *)0x0;
      }
      else {
        plVar6 = plVar2[-1].exts;
      }
      if (plVar6 <= plVar11) break;
      yprp_restr(pctx,(lysp_restr *)((long)&(plVar2->arg).str + lVar9),LY_STMT_MUST,"condition",
                 flag_01);
      plVar11 = (lysp_ext_instance *)((long)&plVar11->name + 1);
      lVar9 = lVar9 + 0x40;
    }
    lVar9 = 0;
    uVar10 = 0;
    while( true ) {
      plVar3 = inout->typedefs;
      if (plVar3 == (lysp_tpdf *)0x0) {
        uVar7 = 0;
      }
      else {
        uVar7 = *(ulong *)&plVar3[-1].flags;
      }
      if (uVar7 <= uVar10) break;
      yprp_typedef(pctx,(lysp_tpdf *)((long)&plVar3->name + lVar9));
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + 0xb0;
    }
    for (grp = inout->groupings; grp != (lysp_node_grp *)0x0; grp = (grp->field_0).field_1.next) {
      yprp_grouping(pctx,grp);
    }
    for (node = inout->child; node != (lysp_node *)0x0; node = node->next) {
      yprp_node(pctx,node);
    }
    uVar4 = *(int *)((long)&pctx->field_0 + 8) - 1;
    (pctx->field_0).field_0.level = (uint16_t)uVar4;
    uVar4 = (uVar4 & 0xffff) * 2;
    if ((undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) !=
        (undefined1  [24])0x0) {
      uVar4 = 0;
    }
    ly_print_((pctx->field_0).field_0.out,"%*s</%s>\n",(ulong)uVar4,"",(inout->field_0).node.name);
    return;
  }
  return;
}

Assistant:

static void
yprp_inout(struct lys_ypr_ctx *pctx, const struct lysp_node_action_inout *inout, ly_bool *flag)
{
    LY_ARRAY_COUNT_TYPE u;
    struct lysp_node *data;
    struct lysp_node_grp *grp;

    if (!inout->child) {
        /* no children */
        return;
    }
    ypr_open(pctx->out, flag);
    YPR_EXTRA_LINE_PRINT(pctx);

    ly_print_(pctx->out, "%*s%s {\n", INDENT, inout->name);
    LEVEL++;

    yprp_extension_instances(pctx, lyplg_ext_nodetype2stmt(inout->nodetype), 0, inout->exts, NULL);
    LY_ARRAY_FOR(inout->musts, u) {
        yprp_restr(pctx, &inout->musts[u], LY_STMT_MUST, NULL);
    }
    LY_ARRAY_FOR(inout->typedefs, u) {
        yprp_typedef(pctx, &inout->typedefs[u]);
    }
    LY_LIST_FOR(inout->groupings, grp) {
        yprp_grouping(pctx, grp);
    }

    LY_LIST_FOR(inout->child, data) {
        yprp_node(pctx, data);
    }

    LEVEL--;
    ypr_close(pctx, 1);
}